

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O3

bool __thiscall packing::AssignedProtos::canFit(AssignedProtos *this,ProtoPalette *protoPal)

{
  _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Var1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_28;
  
  p_Var1 = (_Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            *)uniqueColors(this);
  pvVar2 = ProtoPalette::begin(protoPal);
  pvVar3 = ProtoPalette::end(protoPal);
  local_28 = p_Var1;
  for (; pvVar2 != pvVar3; pvVar2 = pvVar2 + 1) {
    std::
    _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_short_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_short,false>>>>
              (p_Var1,pvVar2,&local_28);
  }
  return *(ulong *)(p_Var1 + 0x18) <=
         (ulong)(byte)(options.nbColorsPerPal - options.hasTransparentPixels);
}

Assistant:

bool canFit(ProtoPalette const &protoPal) const {
		auto &colors = uniqueColors();
		colors.insert(protoPal.begin(), protoPal.end());
		return colors.size() <= options.maxOpaqueColors();
	}